

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O2

bool __thiscall auto_array<short>::reserve(auto_array<short> *this,size_t new_capacity)

{
  ulong uVar1;
  short *__src;
  short *__dest;
  ulong uVar2;
  
  uVar1 = this->length_;
  if (uVar1 <= new_capacity) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)new_capacity) {
      uVar2 = new_capacity * 2;
    }
    __dest = (short *)operator_new__(uVar2);
    __src = this->data_;
    if (__src == (short *)0x0) {
      this->capacity_ = new_capacity;
    }
    else {
      if (uVar1 != 0) {
        memcpy(__dest,__src,uVar1 * 2);
      }
      this->capacity_ = new_capacity;
      operator_delete__(__src);
    }
    this->data_ = __dest;
  }
  return uVar1 <= new_capacity;
}

Assistant:

bool reserve(size_t new_capacity)
  {
    if (new_capacity < length_) {
      return false;
    }
    T * new_data = new T[new_capacity];
    if (data_ && length_) {
      PodCopy(new_data, data_, length_);
    }
    capacity_ = new_capacity;
    delete[] data_;
    data_ = new_data;

    return true;
  }